

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zigzag_persistence.h
# Opt level: O2

void __thiscall
Gudhi::zigzag_persistence::Zigzag_persistence<Gudhi::zigzag_persistence::Default_zigzag_options>::
Zigzag_persistence(Zigzag_persistence<Gudhi::zigzag_persistence::Default_zigzag_options> *this,
                  function<void_(int,_int,_int)> *stream_interval,uint preallocationSize)

{
  _Any_data local_50;
  code *local_40;
  code *local_38;
  _Any_data local_30;
  code *local_20;
  code *local_18;
  
  local_30._8_8_ = 0;
  local_18 = std::
             _Function_handler<bool_(unsigned_int,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Zigzag_persistence/include/gudhi/zigzag_persistence.h:267:13)>
             ::_M_invoke;
  local_20 = std::
             _Function_handler<bool_(unsigned_int,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Zigzag_persistence/include/gudhi/zigzag_persistence.h:267:13)>
             ::_M_manager;
  local_50._8_8_ = 0;
  local_38 = std::
             _Function_handler<bool_(unsigned_int,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Zigzag_persistence/include/gudhi/zigzag_persistence.h:273:13)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<bool_(unsigned_int,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Zigzag_persistence/include/gudhi/zigzag_persistence.h:273:13)>
             ::_M_manager;
  local_50._M_unused._M_object = this;
  local_30._M_unused._M_object = this;
  persistence_matrix::
  Matrix<Gudhi::zigzag_persistence::Zigzag_matrix_options<(Gudhi::persistence_matrix::Column_types)4>_>
  ::Matrix(&this->matrix_,preallocationSize,(function<bool_(unsigned_int,_unsigned_int)> *)&local_30
           ,(function<bool_(unsigned_int,_unsigned_int)> *)&local_50,0xffffffff);
  std::_Function_base::~_Function_base((_Function_base *)&local_50);
  std::_Function_base::~_Function_base((_Function_base *)&local_30);
  (this->births_)._M_h._M_buckets = &(this->births_)._M_h._M_single_bucket;
  (this->births_)._M_h._M_bucket_count = 1;
  (this->births_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->births_)._M_h._M_element_count = 0;
  (this->births_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->births_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->births_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  *(undefined8 *)&(this->birthOrdering_).birthToPos_._M_h._M_rehash_policy = 0;
  (this->birthOrdering_).birthToPos_._M_h._M_buckets =
       &(this->birthOrdering_).birthToPos_._M_h._M_single_bucket;
  (this->birthOrdering_).birthToPos_._M_h._M_bucket_count = 1;
  (this->birthOrdering_).birthToPos_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->birthOrdering_).birthToPos_._M_h._M_element_count = 0;
  (this->birthOrdering_).birthToPos_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->birthOrdering_).birthToPos_._M_h._M_rehash_policy._M_next_resize = 0;
  (this->birthOrdering_).birthToPos_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->birthOrdering_).maxBirthPos_ = 0;
  *(undefined8 *)&(this->birthOrdering_).minBirthPos_ = 0xffffffffffffffff;
  std::function<void_(int,_int,_int)>::function(&this->stream_interval_,stream_interval);
  return;
}

Assistant:

Zigzag_persistence(std::function<void(Dimension, Index, Index)> stream_interval,
                     unsigned int preallocationSize = 0)
      : matrix_(
            preallocationSize,
            [this](Matrix_index columnIndex1, Matrix_index columnIndex2) -> bool {
              if (matrix_.get_column(columnIndex1).is_paired()) {
                return matrix_.get_pivot(columnIndex1) < matrix_.get_pivot(columnIndex2);
              }
              return birthOrdering_.birth_order(births_.at(columnIndex1), births_.at(columnIndex2));
            },
            [this](Matrix_index columnIndex1, Matrix_index columnIndex2) -> bool { return false; }),
        numArrow_(-1),
        stream_interval_(std::move(stream_interval)) {}